

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::DeadBranchElimPass::FindFirstExitFromSelectionMerge
          (DeadBranchElimPass *this,uint32_t start_block_id,uint32_t merge_block_id,
          uint32_t loop_merge_id,uint32_t loop_continue_id,uint32_t switch_merge_id)

{
  Op OVar1;
  uint32_t uVar2;
  IRContext *this_00;
  BasicBlock *this_01;
  Instruction *this_02;
  bool bVar3;
  uint local_50;
  uint32_t target;
  uint32_t i_1;
  uint32_t uStack_44;
  bool found_break;
  uint32_t i;
  uint32_t next_block_id;
  Instruction *branch;
  BasicBlock *start_block;
  uint32_t switch_merge_id_local;
  uint32_t loop_continue_id_local;
  uint32_t loop_merge_id_local;
  uint32_t merge_block_id_local;
  uint32_t start_block_id_local;
  DeadBranchElimPass *this_local;
  
  loop_merge_id_local = start_block_id;
  do {
    bVar3 = false;
    if ((loop_merge_id_local != merge_block_id) &&
       (bVar3 = false, loop_merge_id_local != loop_merge_id)) {
      bVar3 = loop_merge_id_local != loop_continue_id;
    }
    if (!bVar3) {
      return (Instruction *)0x0;
    }
    this_00 = Pass::context((Pass *)this);
    this_01 = IRContext::get_instr_block(this_00,loop_merge_id_local);
    this_02 = BasicBlock::terminator(this_01);
    OVar1 = Instruction::opcode(this_02);
    if (OVar1 == OpBranch) {
      uStack_44 = BasicBlock::MergeBlockIdIfAny(this_01);
      if (uStack_44 == 0) {
        uStack_44 = Instruction::GetSingleWordInOperand(this_02,0);
      }
    }
    else if (OVar1 == OpBranchConditional) {
      uStack_44 = BasicBlock::MergeBlockIdIfAny(this_01);
      if (uStack_44 == 0) {
        for (i_1 = 1; i_1 < 3; i_1 = i_1 + 1) {
          uVar2 = Instruction::GetSingleWordInOperand(this_02,i_1);
          if ((uVar2 == loop_merge_id) && (loop_merge_id != merge_block_id)) {
            uStack_44 = Instruction::GetSingleWordInOperand(this_02,3 - i_1);
            break;
          }
          uVar2 = Instruction::GetSingleWordInOperand(this_02,i_1);
          if ((uVar2 == loop_continue_id) && (loop_continue_id != merge_block_id)) {
            uStack_44 = Instruction::GetSingleWordInOperand(this_02,3 - i_1);
            break;
          }
          uVar2 = Instruction::GetSingleWordInOperand(this_02,i_1);
          if ((uVar2 == switch_merge_id) && (switch_merge_id != merge_block_id)) {
            uStack_44 = Instruction::GetSingleWordInOperand(this_02,3 - i_1);
            break;
          }
        }
        if (uStack_44 == 0) {
          return this_02;
        }
      }
    }
    else {
      if (OVar1 != OpSwitch) {
        return (Instruction *)0x0;
      }
      uStack_44 = BasicBlock::MergeBlockIdIfAny(this_01);
      if (uStack_44 == 0) {
        bVar3 = false;
        for (local_50 = 1; uVar2 = Instruction::NumInOperands(this_02), local_50 < uVar2;
            local_50 = local_50 + 2) {
          uVar2 = Instruction::GetSingleWordInOperand(this_02,local_50);
          if (uVar2 == merge_block_id) {
            bVar3 = true;
          }
          else if ((uVar2 != loop_merge_id) && (uVar2 != loop_continue_id)) {
            uStack_44 = Instruction::GetSingleWordInOperand(this_02,local_50);
          }
        }
        if (uStack_44 == 0) {
          return (Instruction *)0x0;
        }
        if (bVar3) {
          return this_02;
        }
      }
    }
    loop_merge_id_local = uStack_44;
  } while( true );
}

Assistant:

Instruction* DeadBranchElimPass::FindFirstExitFromSelectionMerge(
    uint32_t start_block_id, uint32_t merge_block_id, uint32_t loop_merge_id,
    uint32_t loop_continue_id, uint32_t switch_merge_id) {
  // To find the "first" exit, we follow branches looking for a conditional
  // branch that is not in a nested construct and is not the header of a new
  // construct.  We follow the control flow from |start_block_id| to find the
  // first one.

  while (start_block_id != merge_block_id && start_block_id != loop_merge_id &&
         start_block_id != loop_continue_id) {
    BasicBlock* start_block = context()->get_instr_block(start_block_id);
    Instruction* branch = start_block->terminator();
    uint32_t next_block_id = 0;
    switch (branch->opcode()) {
      case spv::Op::OpBranchConditional:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // If a possible target is the |loop_merge_id| or |loop_continue_id|,
          // which are not the current merge node, then we continue the search
          // with the other target.
          for (uint32_t i = 1; i < 3; i++) {
            if (branch->GetSingleWordInOperand(i) == loop_merge_id &&
                loop_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == loop_continue_id &&
                loop_continue_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
            if (branch->GetSingleWordInOperand(i) == switch_merge_id &&
                switch_merge_id != merge_block_id) {
              next_block_id = branch->GetSingleWordInOperand(3 - i);
              break;
            }
          }

          if (next_block_id == 0) {
            return branch;
          }
        }
        break;
      case spv::Op::OpSwitch:
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          // A switch with no merge instructions can have at most 5 targets:
          //   a. |merge_block_id|
          //   b. |loop_merge_id|
          //   c. |loop_continue_id|
          //   d. |switch_merge_id|
          //   e. 1 block inside the current region.
          //
          // Note that because this is a switch, |merge_block_id| must equal
          // |switch_merge_id|.
          //
          // This leads to a number of cases of what to do.
          //
          // 1. Does not jump to a block inside of the current construct.  In
          // this case, there is not conditional break, so we should return
          // |nullptr|.
          //
          // 2. Jumps to |merge_block_id| and a block inside the current
          // construct.  In this case, this branch conditionally break to the
          // end of the current construct, so return the current branch.
          //
          // 3.  Otherwise, this branch may break, but not to the current merge
          // block.  So we continue with the block that is inside the loop.
          bool found_break = false;
          for (uint32_t i = 1; i < branch->NumInOperands(); i += 2) {
            uint32_t target = branch->GetSingleWordInOperand(i);
            if (target == merge_block_id) {
              found_break = true;
            } else if (target != loop_merge_id && target != loop_continue_id) {
              next_block_id = branch->GetSingleWordInOperand(i);
            }
          }

          if (next_block_id == 0) {
            // Case 1.
            return nullptr;
          }

          if (found_break) {
            // Case 2.
            return branch;
          }

          // The fall through is case 3.
        }
        break;
      case spv::Op::OpBranch:
        // Need to check if this is the header of a loop nested in the
        // selection construct.
        next_block_id = start_block->MergeBlockIdIfAny();
        if (next_block_id == 0) {
          next_block_id = branch->GetSingleWordInOperand(0);
        }
        break;
      default:
        return nullptr;
    }
    start_block_id = next_block_id;
  }
  return nullptr;
}